

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  byte *pbVar1;
  pointer __dest;
  bool bVar2;
  uint32 first_byte_or_zero;
  int size;
  string *psVar3;
  ulong uVar4;
  LogMessage *other;
  byte bVar5;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*p == (string *)&fixed_address_empty_string_abi_cxx11_) {
    psVar3 = (string *)operator_new(0x20);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    psVar3->_M_string_length = 0;
    (psVar3->field_2)._M_local_buf[0] = '\0';
    *p = psVar3;
  }
  psVar3 = *p;
  pbVar1 = input->buffer_;
  if (pbVar1 < input->buffer_end_) {
    bVar5 = *pbVar1;
    uVar4 = (ulong)bVar5;
    first_byte_or_zero = (uint32)bVar5;
    if (-1 < (char)bVar5) {
      input->buffer_ = pbVar1 + 1;
      bVar5 = 0;
      goto LAB_00335f7b;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar5 = (byte)(uVar4 >> 0x3f);
LAB_00335f7b:
  size = (int)uVar4;
  if (size < 0 || bVar5 != 0) {
    bVar2 = false;
  }
  else {
    if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < size) {
      bVar2 = io::CodedInputStream::ReadStringFallback(input,psVar3,size);
      return bVar2;
    }
    uVar4 = uVar4 & 0xffffffff;
    std::__cxx11::string::resize((ulong)psVar3,(char)uVar4);
    __dest = (psVar3->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                 ,0x3c);
      other = LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,input->buffer_,uVar4);
    input->buffer_ = input->buffer_ + uVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string** p) {
  if (*p == &::google::protobuf::internal::GetEmptyStringAlreadyInited()) {
    *p = new ::std::string();
  }
  return ReadBytesToString(input, *p);
}